

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

dgListNode * __thiscall
dgList<dgList<dgConvexHull3DFace>::dgListNode_*>::Addtop
          (dgList<dgList<dgConvexHull3DFace>::dgListNode_*> *this,dgListNode **element)

{
  dgListNode *pdVar1;
  dgListNode *pdVar2;
  
  this->m_count = this->m_count + 1;
  pdVar1 = this->m_last;
  pdVar2 = (dgListNode *)malloc(0x20);
  if (pdVar1 == (dgListNode *)0x0) {
    pdVar2->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_0118ea08;
    pdVar2->m_info = *element;
    pdVar2->m_next = (dgListNode *)0x0;
    pdVar2->m_prev = (dgListNode *)0x0;
    this->m_last = pdVar2;
  }
  else {
    pdVar1 = this->m_first;
    pdVar2->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_0118ea08;
    pdVar2->m_info = *element;
    pdVar2->m_prev = (dgListNode *)0x0;
    pdVar2->m_next = pdVar1;
    if (pdVar1 != (dgListNode *)0x0) {
      pdVar1->m_prev = pdVar2;
    }
  }
  this->m_first = pdVar2;
  return pdVar2;
}

Assistant:

typename dgList<T>::dgListNode *dgList<T>::Addtop (const T &element)
{
	m_count	++;
	if (m_last == NULL) {
		m_last = HACD_NEW(dgListNode)(element, NULL, NULL);
		m_first = m_last;
	} else {
		m_first = HACD_NEW(dgListNode)(element, NULL, m_first);
	}
#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
	return m_first;
}